

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O3

void __thiscall xLearn::SquaredLoss::CalcGrad(SquaredLoss *this,DMatrix *matrix,Model *model)

{
  index_t *piVar1;
  ThreadPool *pTVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  size_type __n;
  long lVar9;
  size_t gap;
  real_t rVar10;
  vector<float,_std::allocator<float>_> sum;
  Logger local_c0;
  int local_bc;
  undefined1 local_b8 [32];
  string local_98;
  undefined1 local_78;
  Score *local_70;
  Model *local_68;
  DMatrix *local_60;
  ulong local_58;
  DMatrix *local_50;
  Model *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_48 = model;
  if (matrix == (DMatrix *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_c0.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/squared_loss.cc"
               ,"");
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CalcGrad","");
    poVar4 = Logger::Start(ERR,&local_98,0x76,(string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/squared_loss.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x76);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matrix",6);
    std::operator<<(poVar4," == NULL \n");
  }
  else {
    uVar5 = (ulong)matrix->row_length;
    if (uVar5 != 0) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + matrix->row_length;
      iVar7 = 1;
      if ((this->super_Loss).lock_free_ != false) {
        iVar7 = (int)(this->super_Loss).threadNumber_;
      }
      __n = (size_type)iVar7;
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
      local_50 = matrix;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_b8,__n,
                 (value_type_conflict1 *)&local_98,(allocator_type *)&local_c0);
      local_bc = iVar7;
      if (0 < iVar7) {
        uVar3 = uVar5 / __n;
        local_58 = uVar5 % __n;
        lVar8 = __n << 2;
        lVar6 = 0;
        lVar9 = 0;
        do {
          __n = __n - 1;
          local_98.field_2._M_allocated_capacity = uVar3 * lVar9;
          lVar9 = lVar9 + 1;
          uVar5 = uVar3 * lVar9;
          local_98._M_dataplus._M_p = (pointer)sq_gradient_thread;
          local_98._M_string_length = local_58 + uVar5;
          if (__n != 0) {
            local_98._M_string_length = uVar5;
          }
          local_98.field_2._8_8_ = local_b8._0_8_ + lVar6;
          local_78 = (this->super_Loss).norm_;
          local_70 = (this->super_Loss).score_func_;
          local_68 = local_48;
          local_60 = local_50;
          ThreadPool::
          enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>
                    ((ThreadPool *)&stack0xffffffffffffffc0,
                     (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>
                      *)(this->super_Loss).pool_);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          lVar6 = lVar6 + 4;
        } while (lVar8 != lVar6);
      }
      pTVar2 = (this->super_Loss).pool_;
      local_98._M_dataplus._M_p = (pointer)&pTVar2->sync_mutex;
      local_98._M_string_length = local_98._M_string_length & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_98);
      iVar7 = local_bc;
      local_98._M_string_length = CONCAT71(local_98._M_string_length._1_7_,1);
      if ((pTVar2->sync).super___atomic_base<int>._M_i != local_bc) {
        do {
          std::condition_variable::wait((unique_lock *)&pTVar2->sync_condition);
        } while ((pTVar2->sync).super___atomic_base<int>._M_i != iVar7);
      }
      LOCK();
      (pTVar2->sync).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_98);
      if (local_b8._8_8_ - local_b8._0_8_ == 0) {
        if ((pointer)local_b8._0_8_ == (pointer)0x0) {
          return;
        }
      }
      else {
        rVar10 = (this->super_Loss).loss_sum_;
        lVar6 = (long)(local_b8._8_8_ - local_b8._0_8_) >> 2;
        lVar8 = 0;
        do {
          rVar10 = rVar10 + *(float *)(local_b8._0_8_ + lVar8 * 4);
          lVar8 = lVar8 + 1;
          (this->super_Loss).loss_sum_ = rVar10;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
      }
      operator_delete((void *)local_b8._0_8_);
      return;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_c0.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/squared_loss.cc"
               ,"");
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CalcGrad","");
    poVar4 = Logger::Start(ERR,&local_98,0x77,(string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/squared_loss.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x77);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matrix->row_length",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  Logger::~Logger(&local_c0);
  abort();
}

Assistant:

void SquaredLoss::CalcGrad(const DMatrix* matrix,
                           Model& model) {
  CHECK_NOTNULL(matrix);
  CHECK_GT(matrix->row_length, 0);
  size_t row_len = matrix->row_length;
  total_example_ += row_len;
  int count = lock_free_ ? threadNumber_ : 1;
  std::vector<real_t> sum(count, 0);
  for (int i = 0; i < count; ++i) {
    size_t start = getStart(row_len, count, i);
    size_t end = getEnd(row_len, count, i);
    pool_->enqueue(std::bind(sq_gradient_thread,
                             matrix,
                             &model,
                             score_func_,
                             norm_,
                             &(sum[i]),
                             start,
                             end));
  }
  // Wait all of the threads finish their job
  pool_->Sync(count);
  // Accumulate loss
  for (int i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}